

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::QPDFArrayItems::iterator::iterator
          (iterator *this,QPDFObjectHandle *oh,bool for_begin)

{
  Members *this_00;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002acfd8;
  this_00 = (Members *)operator_new(0x10);
  Members::Members(this_00,oh,for_begin);
  std::__shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,void>
            ((__shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,(__gnu_cxx::_Lock_policy)2>
              *)&this->m,this_00);
  (this->ivalue).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->ivalue).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  updateIValue(this);
  return;
}

Assistant:

QPDFObjectHandle::QPDFArrayItems::iterator::iterator(QPDFObjectHandle& oh, bool for_begin) :
    m(new Members(oh, for_begin))
{
    updateIValue();
}